

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<MaterialDataV>::~TPZVec(TPZVec<MaterialDataV> *this)

{
  MaterialDataV *pMVar1;
  double dVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a086b8;
  pMVar1 = this->fStore;
  if (pMVar1 != (MaterialDataV *)0x0) {
    dVar2 = pMVar1[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
    if (dVar2 != 0.0) {
      lVar5 = (long)dVar2 * 0x98;
      do {
        TPZManVector<double,_10>::~TPZManVector
                  ((TPZManVector<double,_10> *)((long)pMVar1 + lVar5 + -0x70));
        plVar4 = (long *)((long)pMVar1 + lVar5 + -0x80);
        plVar3 = *(long **)((long)pMVar1 + lVar5 + -0x90);
        if (plVar4 != plVar3) {
          operator_delete(plVar3,*plVar4 + 1);
        }
        lVar5 = lVar5 + -0x98;
      } while (lVar5 != 0);
    }
    operator_delete__(pMVar1[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                      (long)dVar2 * 0x98 + 8);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}